

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComputeM6.cpp
# Opt level: O2

metric6_def_t * ComputeM6::GetTable(char *m6_prefix)

{
  int iVar1;
  metric6_def_t *pmVar2;
  long lVar3;
  
  pmVar2 = (metric6_def_t *)0x0;
  for (lVar3 = 0; lVar3 != 0x240; lVar3 = lVar3 + 0x20) {
    iVar1 = strcmp(m6_prefix,*(char **)((long)&m6_metrics_list[0].m6_prefix + lVar3));
    if (iVar1 == 0) {
      pmVar2 = (metric6_def_t *)((long)&m6_metrics_list[0].m6_prefix + lVar3);
    }
  }
  return pmVar2;
}

Assistant:

metric6_def_t const * ComputeM6::GetTable(char const * m6_prefix)
{
    size_t m6_size = sizeof(m6_metrics_list) / sizeof(metric6_def_t);
    metric6_def_t const * ret = NULL;

    for (size_t i = 0; i < m6_size; i++) {
        if (strcmp(m6_prefix, m6_metrics_list[i].m6_prefix) == 0) {
            ret = &m6_metrics_list[i];
        }
    }

    return ret;
}